

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::TransitionBufferState
          (DeviceContextVkImpl *this,BufferVkImpl *BufferVk,RESOURCE_STATE OldState,
          RESOURCE_STATE NewState,bool UpdateBufferState)

{
  RESOURCE_STATE RVar1;
  VkPipelineStageFlags srcAccessMask;
  VkPipelineStageFlags dstAccessMask;
  VkPipelineStageFlags SrcStages;
  VkPipelineStageFlags DstStages;
  size_t sVar2;
  RESOURCE_STATE RVar3;
  char (*Args_1) [39];
  RESOURCE_STATE extraout_EDX;
  RESOURCE_STATE State;
  undefined7 in_register_00000081;
  char (*Args_2) [70];
  string msg;
  String local_70;
  String local_50;
  
  Args_2 = (char (*) [70])CONCAT71(in_register_00000081,UpdateBufferState);
  RVar3 = OldState;
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[55]>
              (&msg,(char (*) [55])"State transitions are not allowed inside a render pass");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"TransitionBufferState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xc46);
    std::__cxx11::string::~string((string *)&msg);
    RVar3 = extraout_EDX;
  }
  RVar1 = (BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).m_State;
  if (OldState == RESOURCE_STATE_UNKNOWN) {
    OldState = RVar1;
    if (RVar1 == RESOURCE_STATE_UNKNOWN) {
      FormatString<char[43],char_const*,char[70]>
                (&msg,(Diligent *)"Failed to transition the state of buffer \'",
                 (char (*) [43])
                 &(BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  .m_Desc,(char **)
                          "\' because the buffer state is unknown and is not explicitly specified",
                 Args_2);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
      return;
    }
  }
  else if (RVar1 != OldState && RVar1 != RESOURCE_STATE_UNKNOWN) {
    GetResourceStateString_abi_cxx11_(&local_70,(Diligent *)(ulong)RVar1,RVar3);
    GetResourceStateString_abi_cxx11_(&local_50,(Diligent *)(ulong)OldState,State);
    FormatString<char[11],std::__cxx11::string,char[13],char_const*,char[32],std::__cxx11::string,char[26]>
              (&msg,(Diligent *)"The state ",(char (*) [11])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6daa3c,
               (char (*) [13])
               &(BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                .m_Desc,(char **)"\' does not match the old state ",(char (*) [32])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " specified by the barrier",(char (*) [26])msg._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  RVar3 = ~OldState & NewState |
          OldState &
          (RESOURCE_STATE_BUILD_AS_WRITE|RESOURCE_STATE_RESOLVE_DEST|RESOURCE_STATE_COPY_DEST|
           RESOURCE_STATE_UNORDERED_ACCESS|RESOURCE_STATE_RENDER_TARGET);
  Args_1 = (char (*) [39])(ulong)RVar3;
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    if ((BufferVk->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
      FormatString<char[38]>(&msg,(char (*) [38])"Cannot transition suballocated buffer");
      Args_1 = (char (*) [39])0xc62;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"TransitionBufferState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xc62);
      std::__cxx11::string::~string((string *)&msg);
    }
    sVar2 = GetDynamicBufferOffset(this,BufferVk,true);
    if (sVar2 != 0) {
      FormatString<char[26],char[39]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GetDynamicBufferOffset(&BufferVk) == 0",Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"TransitionBufferState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xc63);
      std::__cxx11::string::~string((string *)&msg);
    }
    EnsureVkCmdBuffer(this);
    srcAccessMask = ResourceStateFlagsToVkAccessFlags(OldState);
    dstAccessMask = ResourceStateFlagsToVkAccessFlags(NewState);
    SrcStages = ResourceStateFlagsToVkPipelineStageFlags(OldState);
    DstStages = ResourceStateFlagsToVkPipelineStageFlags(NewState);
    VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
              (&this->m_CommandBuffer,srcAccessMask,dstAccessMask,SrcStages,DstStages);
    if (UpdateBufferState) {
      (BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).m_State = NewState;
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionBufferState(BufferVkImpl& BufferVk, RESOURCE_STATE OldState, RESOURCE_STATE NewState, bool UpdateBufferState)
{
    VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
    if (OldState == RESOURCE_STATE_UNKNOWN)
    {
        if (BufferVk.IsInKnownState())
        {
            OldState = BufferVk.GetState();
        }
        else
        {
            LOG_ERROR_MESSAGE("Failed to transition the state of buffer '", BufferVk.GetDesc().Name, "' because the buffer state is unknown and is not explicitly specified");
            return;
        }
    }
    else
    {
        if (BufferVk.IsInKnownState() && BufferVk.GetState() != OldState)
        {
            LOG_ERROR_MESSAGE("The state ", GetResourceStateString(BufferVk.GetState()), " of buffer '",
                              BufferVk.GetDesc().Name, "' does not match the old state ", GetResourceStateString(OldState),
                              " specified by the barrier");
        }
    }

    // Always add barrier after writes.
    const bool AfterWrite = ResourceStateHasWriteAccess(OldState);

    if (((OldState & NewState) != NewState) || AfterWrite)
    {
        DEV_CHECK_ERR(BufferVk.m_VulkanBuffer != VK_NULL_HANDLE, "Cannot transition suballocated buffer");
        VERIFY_EXPR(GetDynamicBufferOffset(&BufferVk) == 0);

        EnsureVkCmdBuffer();
        VkPipelineStageFlags OldAccessFlags = ResourceStateFlagsToVkAccessFlags(OldState);
        VkPipelineStageFlags NewAccessFlags = ResourceStateFlagsToVkAccessFlags(NewState);
        VkPipelineStageFlags OldStages      = ResourceStateFlagsToVkPipelineStageFlags(OldState);
        VkPipelineStageFlags NewStages      = ResourceStateFlagsToVkPipelineStageFlags(NewState);
        m_CommandBuffer.MemoryBarrier(OldAccessFlags, NewAccessFlags, OldStages, NewStages);
        if (UpdateBufferState)
        {
            BufferVk.SetState(NewState);
        }
    }
}